

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_decoder.c
# Opt level: O2

lzma_ret lzma_block_header_decode(lzma_block *block,lzma_allocator *allocator,uint8_t *in)

{
  uint8_t *puVar1;
  byte bVar2;
  lzma_filter *plVar3;
  uint32_t uVar4;
  lzma_ret lVar5;
  lzma_vli lVar6;
  size_t sVar7;
  long lVar8;
  size_t size;
  size_t in_pos;
  lzma_allocator *local_38;
  
  bVar2 = in[1];
  in_pos = 2;
  plVar3 = block->filters;
  for (lVar8 = 8; lVar8 != 0x58; lVar8 = lVar8 + 0x10) {
    *(undefined8 *)((long)plVar3 + lVar8 + -8) = 0xffffffffffffffff;
    *(undefined8 *)((long)&plVar3->id + lVar8) = 0;
  }
  block->version = 0;
  if ((uint)*in * 4 + 4 != block->header_size) {
    return LZMA_PROG_ERROR;
  }
  if (0xf < block->check) {
    return LZMA_PROG_ERROR;
  }
  size = (ulong)*in * 4;
  uVar4 = lzma_crc32(in,size,0);
  if (uVar4 != *(uint32_t *)(in + size)) {
    return LZMA_DATA_ERROR;
  }
  if ((in[1] & 0x3c) != 0) {
    return LZMA_OPTIONS_ERROR;
  }
  if ((in[1] & 0x40) == 0) {
    block->compressed_size = 0xffffffffffffffff;
  }
  else {
    lVar5 = lzma_vli_decode(&block->compressed_size,(size_t *)0x0,in,&in_pos,size);
    if (lVar5 != LZMA_OK) {
      return lVar5;
    }
    lVar6 = lzma_block_unpadded_size(block);
    if (lVar6 == 0) {
      return LZMA_DATA_ERROR;
    }
  }
  if ((char)in[1] < '\0') {
    lVar5 = lzma_vli_decode(&block->uncompressed_size,(size_t *)0x0,in,&in_pos,size);
    if (lVar5 != LZMA_OK) {
      return lVar5;
    }
  }
  else {
    block->uncompressed_size = 0xffffffffffffffff;
  }
  lVar8 = 0;
  local_38 = allocator;
  while ((ulong)((bVar2 & 3) << 4) + 0x20 != lVar8 + 0x10) {
    lVar5 = lzma_filter_flags_decode
                      ((lzma_filter *)((long)&block->filters->id + lVar8),local_38,in,&in_pos,size);
    lVar8 = lVar8 + 0x10;
    if (lVar5 != LZMA_OK) goto LAB_0019c507;
  }
  lVar5 = LZMA_OPTIONS_ERROR;
  sVar7 = in_pos;
  do {
    if (size <= sVar7) {
      return LZMA_OK;
    }
    in_pos = sVar7 + 1;
    puVar1 = in + sVar7;
    sVar7 = in_pos;
  } while (*puVar1 == '\0');
LAB_0019c507:
  free_properties(block,local_38);
  return lVar5;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_decode(lzma_block *block,
		lzma_allocator *allocator, const uint8_t *in)
{
	const size_t filter_count = (in[1] & 3) + 1;
	size_t in_size;
	size_t i;

	// Start after the Block Header Size and Block Flags fields.
	size_t in_pos = 2;

	// NOTE: We consider the header to be corrupt not only when the
	// CRC32 doesn't match, but also when variable-length integers
	// are invalid or over 63 bits, or if the header is too small
	// to contain the claimed information.

	// Initialize the filter options array. This way the caller can
	// safely free() the options even if an error occurs in this function.
	for (i = 0; i <= LZMA_FILTERS_MAX; ++i) {
		block->filters[i].id = LZMA_VLI_UNKNOWN;
		block->filters[i].options = NULL;
	}

	// Always zero for now.
	block->version = 0;

	// Validate Block Header Size and Check type. The caller must have
	// already set these, so it is a programming error if this test fails.
	if (lzma_block_header_size_decode(in[0]) != block->header_size
			|| (unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	// Exclude the CRC32 field.
	in_size = block->header_size - 4;

	// Verify CRC32
	if (lzma_crc32(in, in_size, 0) != unaligned_read32le(in + in_size))
		return LZMA_DATA_ERROR;

	// Check for unsupported flags.
	if (in[1] & 0x3C)
		return LZMA_OPTIONS_ERROR;

	// Compressed Size
	if (in[1] & 0x40) {
		return_if_error(lzma_vli_decode(&block->compressed_size,
				NULL, in, &in_pos, in_size));

		// Validate Compressed Size. This checks that it isn't zero
		// and that the total size of the Block is a valid VLI.
		if (lzma_block_unpadded_size(block) == 0)
			return LZMA_DATA_ERROR;
	} else {
		block->compressed_size = LZMA_VLI_UNKNOWN;
	}

	// Uncompressed Size
	if (in[1] & 0x80)
		return_if_error(lzma_vli_decode(&block->uncompressed_size,
				NULL, in, &in_pos, in_size));
	else
		block->uncompressed_size = LZMA_VLI_UNKNOWN;

	// Filter Flags
	for (i = 0; i < filter_count; ++i) {
		const lzma_ret ret = lzma_filter_flags_decode(
				&block->filters[i], allocator,
				in, &in_pos, in_size);
		if (ret != LZMA_OK) {
			free_properties(block, allocator);
			return ret;
		}
	}

	// Padding
	while (in_pos < in_size) {
		if (in[in_pos++] != 0x00) {
			free_properties(block, allocator);

			// Possibly some new field present so use
			// LZMA_OPTIONS_ERROR instead of LZMA_DATA_ERROR.
			return LZMA_OPTIONS_ERROR;
		}
	}

	return LZMA_OK;
}